

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O2

int __thiscall
SoftSynthMIDIDevice::OpenStream
          (SoftSynthMIDIDevice *this,int chunks,int flags,
          _func_void_uint_void_ptr_DWORD_DWORD *callback,void *userdata)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])
                    (GSnd,FillStream,
                     (ulong)(uint)(this->SampleRate / chunks << ((byte)flags & 1 ^ 3)),
                     (ulong)(flags | 8),(ulong)(uint)this->SampleRate,this);
  this->Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  if ((SoundStream *)CONCAT44(extraout_var,iVar1) == (SoundStream *)0x0) {
    iVar1 = 2;
  }
  else {
    this->Callback = callback;
    this->CallbackData = userdata;
    *(undefined4 *)&this->Tempo = 0;
    *(undefined4 *)((long)&this->Tempo + 4) = 0x411e8480;
    *(undefined4 *)&this->Division = 0;
    *(undefined4 *)((long)&this->Division + 4) = 0x40590000;
    (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x19])(this);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int SoftSynthMIDIDevice::OpenStream(int chunks, int flags, void (*callback)(unsigned int, void *, DWORD, DWORD), void *userdata)
{
	int chunksize = (SampleRate / chunks) * 4;
	if (!(flags & SoundStream::Mono))
	{
		chunksize *= 2;
	}
	Stream = GSnd->CreateStream(FillStream, chunksize, SoundStream::Float | flags, SampleRate, this);
	if (Stream == NULL)
	{
		return 2;
	}

	Callback = callback;
	CallbackData = userdata;
	Tempo = 500000;
	Division = 100;
	CalcTickRate();
	return 0;
}